

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_conv.cpp
# Opt level: O3

MatrixXd * __thiscall
LayerConv::img2mat(MatrixXd *__return_storage_ptr__,LayerConv *this,ImageVolume *input,
                  LayerSize *output_size,size_t f,int p,int s)

{
  Index dstRows;
  pointer pvVar1;
  long lVar2;
  Index IVar3;
  pointer pMVar4;
  ulong uVar5;
  pointer pvVar6;
  PointerType pdVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  MatrixXd channel_pad;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator_1;
  assign_op<double,_double> local_191;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_190;
  ulong local_188;
  LayerSize *local_180;
  DstXprType local_178;
  ulong local_140;
  ImageVolume *local_138;
  long local_130;
  long local_128;
  size_t local_120;
  void *local_118;
  long local_110;
  long local_108;
  DenseStorage<double,__1,__1,__1,_0> local_100;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  long local_d0;
  ulong local_c8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_c0;
  long local_a0;
  long local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  DstEvaluatorType local_58;
  double *local_40;
  ulong local_38;
  
  pvVar1 = (input->
           super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar2 = *(long *)&(pvVar1->
                    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    )._M_impl.super__Vector_impl_data;
  local_e0 = *(ulong *)(lVar2 + 8);
  local_e8 = *(ulong *)(lVar2 + 0x10);
  lVar9 = output_size->cols * output_size->rows;
  local_178.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       (PointerType)(local_e0 + (long)(p * 2));
  local_178.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
  m_value = (long)(p * 2) + local_e8;
  local_178.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = 0;
  local_190 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__;
  local_180 = output_size;
  local_138 = input;
  if (-1 < (long)(local_178.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                  .m_rows.m_value |
                 (ulong)local_178.
                        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                        .m_data)) {
    local_188 = f * f;
    uVar12 = local_188 * -0x5555555555555555 *
             ((long)*(pointer *)
                     ((long)&(pvVar1->
                             super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             )._M_impl.super__Vector_impl_data + 8) - lVar2 >> 3);
    pdVar7 = (PointerType)
             (((long)(input->
                     super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
              -0x5555555555555555 * lVar9);
    local_a0 = lVar9;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_118,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_178);
    local_178.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
    m_value = 0;
    local_178.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
         pdVar7;
    local_178.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
    m_value = uVar12;
    if (-1 < (long)((ulong)pdVar7 | uVar12)) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                (local_190,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_178);
      pvVar1 = (local_138->
               super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pvVar6 = (local_138->
               super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pvVar6 != pvVar1) {
        uVar10 = (ulong)p;
        local_78 = local_e8 | local_e0;
        local_80 = local_e0 | uVar10;
        local_88 = local_e8 | uVar10;
        local_d0 = (long)s;
        pMVar4 = (pvVar1->
                 super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_98 = local_188 * 8;
        local_130 = 0;
        local_140 = 0;
        uVar12 = local_e0;
        uVar8 = local_e8;
        local_120 = f;
        local_90 = uVar10;
        do {
          if ((pvVar1->
              super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              )._M_impl.super__Vector_impl_data._M_finish != pMVar4) {
            local_70 = local_140 * 3;
            local_128 = 0;
            uVar13 = 0;
            do {
              local_178.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
              .m_data = (PointerType)((long)local_118 + local_110 * uVar10 * 8 + uVar10 * 8);
              pMVar4 = (&(pvVar1->
                         super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)[local_70] + uVar13;
              local_178.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
              .m_rows.m_value = uVar12;
              local_178.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
              .m_cols.m_value = uVar8;
              if (local_118 != (void *)0x0 && (long)local_78 < 0) {
LAB_00114056:
                __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/MapBase.h"
                              ,0xb0,
                              "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>, Level = 0]"
                             );
              }
              local_178.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              m_xpr = (XprTypeNested)&local_118;
              local_178.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              m_outerStride = local_110;
              local_178.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              m_startRow.m_value = uVar10;
              local_178.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              m_startCol.m_value = uVar10;
              if (((((long)local_80 < 0) || ((long)local_88 < 0)) ||
                  ((long)(local_110 - uVar12) < (long)uVar10)) ||
                 ((long)(local_108 - uVar8) < (long)uVar10)) {
LAB_00114037:
                __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/Block.h"
                              ,0x93,
                              "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                             );
              }
              local_100.m_data =
                   (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_data;
              local_100.m_rows =
                   (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows;
              if ((uVar12 != local_100.m_rows) ||
                 (uVar8 != (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                           ).m_storage.m_cols)) {
LAB_00114075:
                __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow to resize.\""
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/DenseBase.h"
                              ,0x101,
                              "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>]"
                             );
              }
              local_58.
              super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              .m_outerStride.m_value = local_110;
              local_c0.m_dst = &local_58;
              local_c0.m_functor = (assign_op<double,_double> *)&local_40;
              local_c0.m_dstExpr = &local_178;
              local_d8 = uVar13;
              local_c0.m_src = (SrcEvaluatorType *)&local_100;
              local_58.
              super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              .m_data = local_178.
                        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                        .m_data;
              Eigen::internal::
              dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
              ::run(&local_c0);
              IVar3 = local_180->rows;
              if (0 < IVar3) {
                local_c8 = local_d8 * local_188;
                local_68 = local_c8 | local_188;
                lVar2 = local_180->cols;
                uVar12 = 0;
                iVar11 = 0;
                do {
                  if (0 < lVar2) {
                    local_60 = uVar12 | f;
                    uVar8 = iVar11 + local_130;
                    lVar9 = uVar8 * 8;
                    uVar10 = 0;
                    do {
                      local_178.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                      .m_data = (PointerType)((long)local_118 + local_110 * uVar10 * 8 + uVar12 * 8)
                      ;
                      local_178.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                      .m_rows.m_value = local_120;
                      local_178.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                      .m_cols.m_value = local_120;
                      if (local_118 != (void *)0x0 && (long)local_120 < 0) goto LAB_00114056;
                      local_178.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .m_xpr = (XprTypeNested)&local_118;
                      local_178.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .m_outerStride = local_110;
                      local_178.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .m_startRow.m_value = uVar12;
                      local_178.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .m_startCol.m_value = uVar10;
                      if ((((long)local_60 < 0) || ((long)(uVar10 | local_120) < 0)) ||
                         (((long)(local_110 - local_120) < (long)uVar12 ||
                          ((long)(local_108 - local_120) < (long)uVar10)))) goto LAB_00114037;
                      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
                      PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
                                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_100,
                                 (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                                  *)&local_178);
                      Eigen::internal::
                      inplace_transpose_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false,_false>
                      ::run((Matrix<double,__1,__1,_0,__1,__1> *)&local_100);
                      uVar13 = local_188;
                      if ((long)local_188 < 0) {
                        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/PlainObjectBase.h"
                                      ,0x11d,
                                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                                     );
                      }
                      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                                (&local_100,local_188,1,local_188);
                      local_178.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .m_outerStride = *(Index *)(local_190 + 8);
                      local_178.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                      .m_data = (PointerType)
                                (local_128 *
                                 local_178.
                                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                                 .
                                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                                 .m_outerStride + *(long *)local_190 + lVar9);
                      local_178.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                      .m_rows.m_value = 1;
                      local_178.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                      .m_cols.m_value = uVar13;
                      local_178.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .m_xpr = (XprTypeNested)local_190;
                      local_178.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .m_startCol.m_value = local_c8;
                      local_178.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .m_startRow.m_value = uVar8;
                      if (((((long)uVar8 < 0) || ((long)local_68 < 0)) ||
                          (local_178.
                           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                           .m_outerStride <= (long)uVar8)) ||
                         ((long)(*(long *)(local_190 + 0x10) - local_188) < (long)local_c8))
                      goto LAB_00114037;
                      local_40 = local_100.m_data;
                      local_38 = local_100.m_rows;
                      if ((local_100.m_rows != 1) || (local_188 != local_100.m_cols))
                      goto LAB_00114075;
                      local_c0.m_dst = &local_58;
                      local_c0.m_src = (SrcEvaluatorType *)&local_40;
                      local_c0.m_functor = &local_191;
                      local_c0.m_dstExpr = &local_178;
                      local_58.
                      super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .
                      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                      .m_data = local_178.
                                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                                .m_data;
                      local_58.
                      super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .
                      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                      .m_outerStride.m_value =
                           local_178.
                           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                           .m_outerStride;
                      Eigen::internal::
                      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
                      ::run(&local_c0);
                      free(local_100.m_data);
                      uVar10 = uVar10 + local_d0;
                      lVar2 = local_180->cols;
                      uVar8 = uVar8 + 1;
                      lVar9 = lVar9 + 8;
                      iVar11 = iVar11 + 1;
                    } while ((long)uVar10 < lVar2);
                    IVar3 = local_180->rows;
                    f = local_120;
                  }
                  uVar12 = uVar12 + local_d0;
                } while ((long)uVar12 < IVar3);
              }
              uVar13 = local_d8 + 1;
              pvVar1 = (local_138->
                       super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pMVar4 = (pvVar1->
                       super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              uVar5 = ((long)(pvVar1->
                             super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar4 >> 3) *
                      -0x5555555555555555;
              local_128 = local_128 + local_98;
              uVar12 = local_e0;
              uVar8 = local_e8;
              uVar10 = local_90;
            } while (uVar13 <= uVar5 && uVar5 - uVar13 != 0);
            pvVar6 = (local_138->
                     super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          }
          local_140 = local_140 + 1;
          uVar13 = ((long)pvVar6 - (long)pvVar1 >> 3) * -0x5555555555555555;
          local_130 = local_130 + local_a0;
        } while (local_140 <= uVar13 && uVar13 - local_140 != 0);
      }
      free(local_118);
      return (MatrixXd *)local_190;
    }
  }
  local_178.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = 0;
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

Eigen::MatrixXd LayerConv::img2mat(const ImageVolume& input, const LayerSize& output_size, size_t f, int p, int s) {
	auto f_size = f * f; // filter total size.
	auto rows = input[0][0].rows();
	auto cols = input[0][0].cols();
	auto conv_size = output_size.rows * output_size.cols;
	auto rows_input_mat = conv_size * input.size();
	auto cols_input_mat = input[0].size() * f_size;
	MatrixXd channel_pad = MatrixXd::Constant(rows + 2 * p, cols + 2 * p, 0);
	MatrixXd input_mat = MatrixXd::Constant(rows_input_mat, cols_input_mat, 0);
	for (auto img_ind = 0; img_ind < input.size(); img_ind++) {
		for (auto c = 0; c < input[0].size(); c++) {
			auto& channel = input[img_ind][c];
			channel_pad.block(p, p, rows, cols) = channel;
			for (int i = 0, row = 0; i < output_size.rows; i += s) {
				for (int j = 0; j < output_size.cols; j += s, row++) {
					MatrixXd v = channel_pad.block(i, j, f, f);
					v.transposeInPlace();
					v.resize(1, f_size);
					input_mat.block(img_ind * conv_size + row, c * f_size, 1, f_size) = v;
				}
			}
		}
	}

	return input_mat;
}